

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

variable_order_t * __thiscall
merlin::graphical_model::order
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  uint uVar1;
  double dVar2;
  unsigned_long uVar3;
  size_t i;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pointer puVar8;
  ulong uVar9;
  pointer pmVar10;
  iterator iVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  pointer pmVar14;
  long lVar15;
  iterator fi;
  long lVar16;
  uint uVar17;
  pointer puVar18;
  long lVar19;
  _Rb_tree_node_base *p_Var20;
  variable_order_t maxOrd;
  variable_set sumVars;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  reverse;
  variable_set fix;
  score_map_t scores;
  ulong local_160;
  variable_set local_158;
  variable_set local_118;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_d8;
  pair<double,_unsigned_long> local_c0;
  vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
  local_b0;
  variable_set local_98;
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (__return_storage_ptr__,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (ord_type.t_ != Random) {
    mrf(&local_d8,this);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Rb_tree_node_base *)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
    ::vector(&local_b0,
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vadj).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_118);
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.m_d = (vsize *)0x0;
    pmVar10 = (this->m_vadj).
              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar14 = (this->m_vadj).
              super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pmVar14 != pmVar10) {
      p_Var12 = (_Base_ptr)0x0;
      do {
        p_Var13 = (_Base_ptr)((long)&p_Var12[1]._M_right + 7);
        if (-1 < (long)p_Var12) {
          p_Var13 = p_Var12;
        }
        if (((var_types->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [((long)p_Var13 >> 6) +
              (ulong)(((ulong)p_Var12 & 0x800000000000003f) < 0x8000000000000001) +
              0xffffffffffffffff] >> ((ulong)p_Var12 & 0x3f) & 1) == 0) {
          dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)p_Var12];
          uVar9 = (ulong)dVar2;
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar2 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var12;
          variable_set::operator|=(&local_118,(variable *)&local_158);
          pmVar10 = (this->m_vadj).
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pmVar14 = (this->m_vadj).
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        p_Var12 = (_Base_ptr)((long)&p_Var12->_M_color + 1);
      } while (p_Var12 < (_Base_ptr)((long)pmVar14 - (long)pmVar10 >> 5));
      if (pmVar14 != pmVar10) {
        p_Var12 = (_Base_ptr)0x0;
        do {
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)order_score(this,&local_d8,(size_t)p_Var12,ord_type);
          local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)p_Var12;
          iVar11 = std::
                   _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                   ::_M_emplace_equal<std::pair<double,unsigned_long>>
                             ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                               *)&local_60,(pair<double,_unsigned_long> *)&local_158);
          local_b0.
          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)p_Var12]._M_node = iVar11._M_node;
          p_Var12 = (_Base_ptr)((long)&p_Var12->_M_color + 1);
          pmVar10 = (this->m_vadj).
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pmVar14 = (this->m_vadj).
                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while (p_Var12 < (_Base_ptr)((long)pmVar14 - (long)pmVar10 >> 5));
        if (pmVar14 != pmVar10) {
          local_160 = 0;
          do {
            p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              p_Var20 = &local_60._M_impl.super__Rb_tree_header._M_header;
              if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
                  (_Rb_tree_node_base *)0x0) {
                p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  if (*(double *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1) <
                      *(double *)(p_Var13 + 1)) {
                    p_Var20 = p_Var13;
                  }
                  p_Var13 = (&p_Var13->_M_left)
                            [*(double *)(p_Var13 + 1) <=
                             *(double *)
                              (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1)];
                } while (p_Var13 != (_Base_ptr)0x0);
              }
              if (local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var20) {
LAB_0012e087:
                __assert_fail("imax > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/util.h"
                              ,0x88,"int merlin::randi(int)");
              }
              iVar6 = 1;
              p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
                iVar6 = iVar6 + -1;
              } while (p_Var13 != p_Var20);
              uVar17 = -iVar6;
              if (0x7ffffffe < uVar17) goto LAB_0012e087;
              if (iVar6 != 0) {
                iVar7 = rand();
                iVar7 = (int)((double)(int)uVar17 * ((double)iVar7 / 2147483647.0));
                uVar1 = iVar7 + 1;
                if (SBORROW4(uVar1,uVar17) != (int)(uVar1 + iVar6) < 0) {
                  uVar17 = uVar1;
                }
                lVar19 = (long)(int)uVar17;
                if (iVar7 < 0) {
                  if (uVar1 != 0) {
                    do {
                      p_Var12 = (_Base_ptr)std::_Rb_tree_decrement(p_Var12);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 != 0);
                  }
                }
                else {
                  do {
                    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                }
              }
            }
            else {
              while( true ) {
                local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var12[1]._M_parent;
                dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(long)local_158.m_v.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start];
                uVar9 = (ulong)dVar2;
                local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)(dVar2 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
                bVar5 = variable_set::contains(&local_118,(variable *)&local_158);
                if (bVar5) break;
                p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
              }
            }
            p_Var12 = p_Var12[1]._M_parent;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[local_160] = (unsigned_long)p_Var12;
            std::
            _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
            ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                *)&local_60,
                               local_b0.
                               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)p_Var12]._M_node);
            dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)p_Var12];
            uVar9 = (ulong)dVar2;
            local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(dVar2 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
            local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)p_Var12;
            variable_set::operator/=(&local_118,(variable *)&local_158);
            variable_set::variable_set
                      (&local_158,
                       local_d8.
                       super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)p_Var12);
            local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_98.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.m_d = (vsize *)0x0;
            if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              lVar19 = 0;
              do {
                lVar15 = *(long *)((_Rb_tree_color *)
                                   local_158.m_v.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar19 * 2);
                variable_set::operator|=
                          (local_d8.
                           super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15,&local_158);
                dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)p_Var12];
                uVar9 = (ulong)dVar2;
                local_c0.second =
                     (long)(dVar2 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
                local_c0.first = (double)p_Var12;
                variable_set::operator/=
                          (local_d8.
                           super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar15,(variable *)&local_c0)
                ;
                if ((ulong)((long)local_98.m_v.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98.m_v.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) <
                    local_60._M_impl.super__Rb_tree_header._M_node_count) {
                  variable_set::operator|=
                            (&local_98,
                             local_d8.
                             super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar15);
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 != (long)local_158.m_v.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_158.m_v.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
              if (local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                lVar19 = 0;
                do {
                  i = local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar19];
                  std::
                  _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                  ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                      *)&local_60,
                                     local_b0.
                                     super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[i]._M_node);
                  local_c0.first = order_score(this,&local_d8,i,ord_type);
                  local_c0.second = i;
                  iVar11 = std::
                           _Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                           ::_M_emplace_equal<std::pair<double,unsigned_long>>
                                     ((_Rb_tree<double,std::pair<double_const,unsigned_long>,std::_Select1st<std::pair<double_const,unsigned_long>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_long>>>
                                       *)&local_60,&local_c0);
                  local_b0.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i]._M_node = iVar11._M_node;
                  lVar19 = lVar19 + 1;
                } while (lVar19 != (long)local_98.m_v.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_98.m_v.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3);
              }
            }
            variable_set::~variable_set(&local_98);
            variable_set::~variable_set(&local_158);
            local_160 = local_160 + 1;
          } while (local_160 <
                   (ulong)((long)(this->m_vadj).
                                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_vadj).
                                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
      }
    }
    variable_set::~variable_set(&local_118);
    if (local_b0.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super__Vector_base<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_d8);
    return __return_storage_ptr__;
  }
  local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  if ((this->m_vadj).
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vadj).
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    puVar18 = (pointer)0x0;
    do {
      puVar8 = (pointer)((long)puVar18 + 0x3f);
      if (-1 < (long)puVar18) {
        puVar8 = puVar18;
      }
      local_98.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar18;
      if (((var_types->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)puVar8 >> 6) +
            (ulong)(((ulong)puVar18 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
           ] >> ((ulong)puVar18 & 0x3f) & 1) == 0) {
        if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_118.m_v,
                     (iterator)
                     local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
        }
        else {
          *local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)puVar18;
          local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish ==
               local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_158.m_v,
                   (iterator)
                   local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
      }
      else {
        *local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)puVar18;
        local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      puVar4 = local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar8 = local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar18 = (pointer)((long)puVar18 + 1);
    } while (puVar18 < (pointer)((long)(this->m_vadj).
                                       super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_vadj).
                                       super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
    if ((local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start + 1 !=
        local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      lVar19 = 8;
      do {
        iVar6 = rand();
        lVar15 = (long)iVar6 % ((lVar19 >> 3) + 1);
        if (lVar19 != lVar15 * 8) {
          uVar3 = *(unsigned_long *)((long)puVar8 + lVar19);
          *(unsigned_long *)((long)puVar8 + lVar19) = puVar8[lVar15];
          puVar8[lVar15] = uVar3;
        }
        lVar15 = lVar19 + 8;
        lVar19 = lVar19 + 8;
      } while ((unsigned_long *)((long)puVar8 + lVar15) != puVar4);
    }
  }
  puVar8 = local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar18 = local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start + 1 !=
      local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    lVar19 = 8;
    do {
      iVar6 = rand();
      lVar15 = (long)iVar6 % ((lVar19 >> 3) + 1);
      if (lVar19 != lVar15 * 8) {
        uVar3 = *(unsigned_long *)((long)puVar18 + lVar19);
        *(unsigned_long *)((long)puVar18 + lVar19) = puVar18[lVar15];
        puVar18[lVar15] = uVar3;
      }
      lVar15 = lVar19 + 8;
      lVar19 = lVar19 + 8;
    } while ((unsigned_long *)((long)puVar18 + lVar15) != puVar8);
  }
  if ((long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    lVar19 = 0;
  }
  else {
    lVar19 = (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    puVar18 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar19 = lVar19 + (ulong)(lVar19 == 0);
    lVar15 = 0;
    do {
      puVar18[lVar15] =
           local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar19 != lVar15);
  }
  if ((long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    if (local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (unsigned_long *)0x0) goto LAB_0012e066;
  }
  else {
    lVar15 = (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    puVar18 = (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      puVar18[lVar19 + lVar16] =
           local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar16);
  }
  operator_delete(local_158.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start);
LAB_0012e066:
  if (local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_118.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

variable_order_t order(OrderMethod ord_type, std::vector<bool> var_types) const {
		variable_order_t order;
		order.resize(nvar());

		if (ord_type == OrderMethod::Random) {	// random orders are treated here
			variable_order_t sumOrd, maxOrd;
			for (size_t i = 0; i < nvar(); i++) {
				//   build a list of all the variables
				if (var_types[i] == true) maxOrd.push_back(var(i).label());
				else sumOrd.push_back(var(i).label());
			}

			std::random_shuffle(sumOrd.begin(), sumOrd.end());//   and randomly permute them
			std::random_shuffle(maxOrd.begin(), maxOrd.end());
			size_t i = 0;
			for (size_t j = 0; j < sumOrd.size(); ++j) order[i++] = sumOrd[j];
			for (size_t j = 0; j < maxOrd.size(); ++j) order[i++] = maxOrd[j];
			return order;											//   then return
		}

		std::vector<variable_set> adj = mrf();
		typedef std::pair<double, size_t> node_score_t;
		typedef std::multimap<double, size_t> score_map_t;
		score_map_t scores;
		std::vector<score_map_t::iterator> reverse(nvar());

		// get the sum and max variables
		variable_set sumVars;
		for (size_t v = 0; v < nvar(); ++v) {
			if (var_types[v] == false) sumVars |= var(v);
		}

		// get initial scores
		for (size_t v = 0; v < nvar(); ++v) {
			reverse[v] = scores.insert(node_score_t(order_score(adj, v, ord_type), v));
		}

		// Iterate through, selecting sum variables first
		for (size_t ii = 0; ii < nvar(); ++ii) {// Iterate through, selecting variables

			score_map_t::iterator first, last;
			if (sumVars.size() > 0) { // Choose a random entry from among the smallest sum vars
				for (score_map_t::iterator fi = scores.begin(); fi != scores.end(); ++fi) {
					variable v = var(fi->second);
					if (sumVars.contains(v)) {
						first = fi;
						last = scores.upper_bound(first->first);
						break;
					}
				}
			} else {
				first = scores.begin();// Choose a random entry from among the smallest
				last = scores.upper_bound(first->first);
				std::advance(first, randi(std::distance(first, last)));
			}
			size_t i = first->second;

			order[ii] = var(i).label(); // save its label in the ordering
			scores.erase(reverse[i]);	// remove it from our list
			sumVars /= var(i);
			variable_set vi = adj[i]; // go through adjacent variables (copy: adj may change)
			variable_set fix;					//   and keep track of which need updating
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				size_t v = _vindex(*j);
				adj[v] |= vi;             // and update their adjacency structures
				adj[v] /= var(i);
				if (fix.size() < scores.size()) {
					if (ord_type == OrderMethod::MinWidth
							|| ord_type == OrderMethod::WtMinWidth)
						fix |= adj[v]; //var(v);				// (width methods only need v, not nbrs)
					else
						fix |= adj[v];	// come back and recalculate their scores
				}
			}
			for (variable_set::const_iterator j = fix.begin(); j != fix.end(); ++j) {
				size_t jj = j->label();
				scores.erase(reverse[jj]);	// remove and update (score,index) pairs
				reverse[jj] = scores.insert(node_score_t(order_score(adj, jj, ord_type), jj));
			}
		}

		return order;
	}